

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hpp
# Opt level: O2

void __thiscall
tf::Executor::_tear_down_async(Executor *this,Worker *worker,Node *node,Node **cache)

{
  atomic<unsigned_long> *paVar1;
  uint uVar2;
  Node *pNVar3;
  
  pNVar3 = node->_parent;
  if (pNVar3 == (Node *)0x0) {
    _decrement_topology(this);
  }
  else {
    uVar2 = pNVar3->_nstate;
    LOCK();
    paVar1 = &pNVar3->_join_counter;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i - 1;
    UNLOCK();
    if (((paVar1->super___atomic_base<unsigned_long>)._M_i == 0) && ((uVar2 & 0x20000000) != 0)) {
      if (*cache != (Node *)0x0) {
        _schedule(this,worker,*cache);
      }
      *cache = pNVar3;
    }
  }
  Node::~Node(node);
  operator_delete(node,0xd8);
  return;
}

Assistant:

inline void Executor::_tear_down_async(Worker& worker, Node* node, Node*& cache) {
  
  // from executor
  if(auto parent = node->_parent; parent == nullptr) {
    _decrement_topology();
  }
  // from runtime
  else {
    auto state = parent->_nstate;
    if(parent->_join_counter.fetch_sub(1, std::memory_order_acq_rel) == 1) {
      if(state & NSTATE::PREEMPTED) {
        _update_cache(worker, cache, parent);
      }
    }
  }
  recycle(node);
}